

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_test.cpp
# Opt level: O1

void __thiscall
shared_ptr_std_container_Test::~shared_ptr_std_container_Test(shared_ptr_std_container_Test *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  testing::Test::~Test(&this->super_Test);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x10);
    return;
  }
  __stack_chk_fail();
}

Assistant:

TEST(shared_ptr, std_container)
{
    // Create a shared_ptr
    shared_ptr<Struct> xPtr(new Struct(123));

    EXPECT_EQ(true, xPtr);
    EXPECT_EQ(true, xPtr.unique());
    EXPECT_EQ(1,    xPtr.use_count());
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,  xPtr->mVal);
    EXPECT_EQ(1, Struct::_mNbInstances);
    Struct* pX = xPtr.get();

    {
        std::vector<shared_ptr<Struct> > PtrList;

        // Copy-it inside a container
        PtrList.push_back(xPtr);

        EXPECT_EQ(true,  xPtr);
        EXPECT_EQ(false, xPtr.unique());
        EXPECT_EQ(2,     xPtr.use_count());
        EXPECT_EQ(2,     PtrList.back().use_count());
        EXPECT_EQ(xPtr,  PtrList.back());
        EXPECT_EQ(pX,    PtrList.back().get());
        EXPECT_EQ(1, Struct::_mNbInstances);

        // And copy-it again
        PtrList.push_back(xPtr);

        EXPECT_EQ(true,  xPtr);
        EXPECT_EQ(false, xPtr.unique());
        EXPECT_EQ(3,     xPtr.use_count());
        EXPECT_EQ(3,     PtrList.back().use_count());
        EXPECT_EQ(xPtr,  PtrList.back());
        EXPECT_EQ(pX,    PtrList.back().get());
        EXPECT_EQ(1, Struct::_mNbInstances);

        // Remove the second pointer from the vector
        PtrList.pop_back();

        EXPECT_EQ(true,  xPtr);
        EXPECT_EQ(false, xPtr.unique());
        EXPECT_EQ(2,     xPtr.use_count());
        EXPECT_EQ(2,     PtrList.back().use_count());
        EXPECT_EQ(xPtr,  PtrList.back());
        EXPECT_EQ(pX,    PtrList.back().get());
        EXPECT_EQ(1, Struct::_mNbInstances);

        // Reset the original pointer, leaving 1 last pointer in the vector
        xPtr.reset();

        EXPECT_EQ(false, xPtr);
        EXPECT_EQ(1,     PtrList.back().use_count());
        EXPECT_EQ(pX,    PtrList.back().get());
        EXPECT_EQ(1, Struct::_mNbInstances);

    } // Destructor of the vector releases the last pointer thus destroying the object

    EXPECT_EQ(0, Struct::_mNbInstances);
}